

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosaraju_scc.cpp
# Opt level: O0

void __thiscall
KosarajuSCC::fillOrder
          (KosarajuSCC *this,int v,bool *visited,
          stack<int,_std::deque<int,_std::allocator<int>_>_> *s)

{
  int iVar1;
  stack<int,_std::deque<int,_std::allocator<int>_>_> *this_00;
  reference pvVar2;
  stack<int,_std::deque<int,_std::allocator<int>_>_> *psVar3;
  reference pvVar4;
  ulong uVar5;
  bool *in_RCX;
  long in_RDX;
  int in_ESI;
  long *in_RDI;
  int u;
  int e;
  uint i;
  value_type *in_stack_ffffffffffffffb8;
  value_type vVar6;
  uint uVar7;
  undefined4 in_stack_fffffffffffffff0;
  
  *(undefined1 *)(in_RDX + in_ESI) = 1;
  uVar7 = 0;
  while( true ) {
    this_00 = (stack<int,_std::deque<int,_std::allocator<int>_>_> *)(ulong)uVar7;
    pvVar2 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)(in_RDI + 2),(long)in_ESI);
    psVar3 = (stack<int,_std::deque<int,_std::allocator<int>_>_> *)
             std::vector<int,_std::allocator<int>_>::size(pvVar2);
    if (psVar3 <= this_00) break;
    pvVar2 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)(in_RDI + 2),(long)in_ESI);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(ulong)uVar7);
    vVar6 = *pvVar4;
    uVar5 = (**(code **)(*in_RDI + 0x10))(in_RDI,vVar6);
    if ((uVar5 & 1) == 0) {
      pvVar2 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)(in_RDI + 8),(long)vVar6);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,1);
      iVar1 = *pvVar4;
      uVar5 = (**(code **)(*in_RDI + 0x18))(in_RDI,iVar1);
      if (((uVar5 & 1) == 0) && ((*(byte *)(in_RDX + iVar1) & 1) == 0)) {
        fillOrder((KosarajuSCC *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                  (int)((ulong)in_RDX >> 0x20),in_RCX,
                  (stack<int,_std::deque<int,_std::allocator<int>_>_> *)CONCAT44(uVar7,vVar6));
      }
    }
    uVar7 = uVar7 + 1;
  }
  std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push(this_00,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void KosarajuSCC::fillOrder(int v, bool visited[], std::stack<int>& s) {
	// Mark the current node as visited and print it
	visited[v] = true;
	// Recur for all the vertices adjacent to this vertex
	for (unsigned int i = 0; i < outgoing[v].size(); ++i) {
		const int e = outgoing[v][i];
		if (ignore_edge(e)) {
			continue;
		}
		const int u = ends[e][1];
		if (ignore_node(u)) {
			continue;
		}
		if (!visited[u]) {
			fillOrder(u, visited, s);
		}
	}

	// All vertices reachable from v are processed by now, push v
	s.push(v);
}